

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::QueryGeometrySeparate::createTransformFeedbackBuffer
          (QueryGeometrySeparate *this)

{
  deUint32 err;
  long lVar1;
  
  lVar1 = (**(code **)(**(long **)(*(long *)(&(this->super_CaptureGeometrySeparate).
                                              super_CaptureGeometryInterleaved.field_0x78 +
                                            (long)(this->super_CaptureGeometrySeparate).
                                                  super_CaptureGeometryInterleaved.
                                                  _vptr_CaptureGeometryInterleaved[-3]) + 8) + 0x18)
          )();
  CaptureVertexSeparate::createTransformFeedbackBuffer
            ((CaptureVertexSeparate *)
             ((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                     _vptr_CaptureGeometryInterleaved +
             (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                   _vptr_CaptureGeometryInterleaved[-4]));
  (**(code **)(lVar1 + 0x6e0))
            (1,&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x14);
  err = (**(code **)(lVar1 + 0x800))();
  glu::checkError(err,"glGenQueries call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xff2);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometrySeparate::createTransformFeedbackBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffer object. */
	gl3cts::TransformFeedback::CaptureGeometrySeparate::createTransformFeedbackBuffer();

	/* Create query object. */
	gl.genQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
}